

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::Clear(UniDirectionalLSTMLayerParams *this)

{
  Arena *pAVar1;
  UniDirectionalLSTMLayerParams *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Clear
            (&this->activations_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->params_ != (LSTMParams *)0x0)) &&
     (this->params_ != (LSTMParams *)0x0)) {
    (*(this->params_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->params_ = (LSTMParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->weightparams_ != (LSTMWeightParams *)0x0)) &&
     (this->weightparams_ != (LSTMWeightParams *)0x0)) {
    (*(this->weightparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weightparams_ = (LSTMWeightParams *)0x0;
  memset(&this->inputvectorsize_,0,0x11);
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  activations_.Clear();
  if (GetArenaNoVirtual() == NULL && params_ != NULL) {
    delete params_;
  }
  params_ = NULL;
  if (GetArenaNoVirtual() == NULL && weightparams_ != NULL) {
    delete weightparams_;
  }
  weightparams_ = NULL;
  ::memset(&inputvectorsize_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
}